

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * GenerateOperaSoftTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  TrackData *pTVar2;
  bool bVar3;
  Sector *this;
  Sector *header;
  Data *data;
  BitBuffer *bitstream;
  pointer sector;
  value_type local_da;
  allocator_type local_d9;
  CylHead *local_d8;
  TrackData *local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  BitstreamTrackBuilder bitbuf;
  
  bVar3 = IsOperaSoftTrack(track);
  if (bVar3) {
    local_d8 = cylhead;
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,false);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_d0 = __return_storage_ptr__;
    for (sector = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start; sector != pSVar1; sector = sector + 1) {
      if ((sector->header).sector == 8) {
        this = Track::operator[](track,7);
        header = Track::operator[](track,8);
        TrackBuilder::addSectorUpToData(&bitbuf.super_TrackBuilder,&header->header,header->dam);
        local_da = 'U';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x100,
                   &local_da,&local_d9);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,(Data *)&local_c8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
        BitstreamTrackBuilder::addCrc(&bitbuf,0x104);
        local_da = 'N';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x410,
                   &local_da,&local_d9);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,(Data *)&local_c8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
        data = Sector::data_copy(this,0);
        TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,data);
      }
      else {
        TrackBuilder::addSector(&bitbuf.super_TrackBuilder,sector,0xf0);
      }
    }
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    pTVar2 = local_d0;
    TrackData::TrackData(local_d0,local_d8,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return pTVar2;
  }
  __assert_fail("IsOperaSoftTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x281,"TrackData GenerateOperaSoftTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateOperaSoftTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsOperaSoftTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    for (auto& sector : track)
    {
        if (sector.header.sector != 8)
            bitbuf.addSector(sector, 0xf0);
        else
        {
            auto& sector7 = track[7];
            auto& sector8 = track[8];

            bitbuf.addSectorUpToData(sector8.header, sector8.dam);
            bitbuf.addBlock(Data(256, 0x55));
            bitbuf.addCrc(4 + 256);
            bitbuf.addBlock(Data(0x512 - 256 - 2, 0x4e));
            bitbuf.addBlock(sector7.data_copy());
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}